

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

void __thiscall
gl4cts::anon_unknown_0::VertexAttribState::VertexAttribState
          (VertexAttribState *this,int attribindex)

{
  deqp::GLWrapper::GLWrapper(&this->super_GLWrapper);
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__GLWrapper_01dcfa30;
  this->array_enabled = 0;
  this->array_size = 4;
  this->array_stride = 0;
  this->array_type = 0x1406;
  this->array_normalized = 0;
  this->array_integer = 0;
  this->array_long = 0;
  this->array_divisor = 0;
  *(undefined8 *)&this->array_divisor = 0;
  *(undefined8 *)((long)&this->array_pointer + 4) = 0;
  this->binding = attribindex;
  this->relative_offset = 0;
  this->index = attribindex;
  return;
}

Assistant:

VertexAttribState(int attribindex)
		: array_enabled(0)
		, array_size(4)
		, array_stride(0)
		, array_type(GL_FLOAT)
		, array_normalized(0)
		, array_integer(0)
		, array_long(0)
		, array_divisor(0)
		, array_pointer(0)
		, array_buffer_binding(0)
		, binding(attribindex)
		, relative_offset(0)
		, index(attribindex)
	{
	}